

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void map_free_all_(map_base_t *m)

{
  uint uVar1;
  map_node_t **ppmVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  map_node_t *key;
  map_node_t *pmVar6;
  
  uVar4 = 0xffffffff;
  pmVar6 = (map_node_t *)0x0;
  do {
    if ((pmVar6 == (map_node_t *)0x0) || (pmVar6 = pmVar6->next, pmVar6 == (map_node_t *)0x0)) {
      uVar1 = m->nbuckets;
      uVar4 = uVar4 + 1;
      uVar5 = uVar4;
      if (uVar4 < uVar1) {
        ppmVar2 = m->buckets + uVar4;
        do {
          pmVar6 = *ppmVar2;
          if (pmVar6 != (map_node_t *)0x0) goto LAB_00102d6d;
          uVar4 = uVar4 + 1;
          ppmVar2 = ppmVar2 + 1;
          uVar5 = uVar1;
        } while (uVar1 != uVar4);
      }
      key = (map_node_t *)0x0;
      uVar4 = uVar5;
    }
    else {
LAB_00102d6d:
      key = pmVar6 + 1;
    }
    if (key == (map_node_t *)0x0) {
      return;
    }
    ppmVar2 = map_getref(m,(char *)key);
    if (ppmVar2 == (map_node_t **)0x0) {
      puVar3 = (undefined8 *)0x0;
    }
    else {
      puVar3 = (undefined8 *)(*ppmVar2)->value;
    }
    if (puVar3 != (undefined8 *)0x0) {
      free((void *)*puVar3);
    }
  } while( true );
}

Assistant:

void map_free_all_(map_base_t *m) {
  const char *key;
  map_iter_t iter = map_iter(m);

  while ((key = map_next_(m, &iter))) {
    void **res = map_get_(m, key);
    if (res != NULL)
      free(*res);
  }
}